

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGeoLocusIntersect.cpp
# Opt level: O3

bool ParseGeoLocusIntersect(string *sLine1,string *sLine2,string *sLine3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  pointer pcVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ostream *poVar10;
  undefined8 uVar11;
  size_type sVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  string sLocusStartLat;
  string sLocusGeoEndLat;
  string sTestId;
  string sPtIntLon;
  LLPoint intersection;
  string sPtIntLat;
  string sIntersectionLat;
  string sLocusGeoEndLong;
  string sIntersectionLong;
  string sGeodesicStartLong;
  string sGeodesicStartLat;
  string sLocusStartLong;
  double local_4b8;
  string sLocusEndLong;
  string sLocusEndLat;
  string sGeodesicEndLong;
  string sGeodesicEndLat;
  string sLocusGeoStartLong;
  pointer local_410;
  pointer local_3f0;
  value_type *local_3b8;
  string sLocusEndDist;
  string sLocusStartDist;
  sregex_token_iterator it;
  LLPoint geoEnd;
  LLPoint geoStart;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string sLocusGeoStartLat;
  
  lVar8 = std::__cxx11::string::find_last_not_of((char *)sLine1,0x15b244,0xffffffffffffffff);
  uVar9 = lVar8 + 1;
  if (sLine1->_M_string_length < uVar9) {
    uVar11 = std::__throw_out_of_range_fmt
                       ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                        "basic_string::erase",uVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sPtIntLat._M_dataplus._M_p != &sPtIntLat.field_2) {
      operator_delete(sPtIntLat._M_dataplus._M_p);
    }
    if ((string *)sIntersectionLong._M_dataplus._M_p != sLine1) {
      operator_delete(sIntersectionLong._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sIntersectionLat._M_dataplus._M_p != &sIntersectionLat.field_2) {
      operator_delete(sIntersectionLat._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusEndDist._M_dataplus._M_p != &sLocusEndDist.field_2) {
      operator_delete(sLocusEndDist._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartDist._M_dataplus._M_p != &sLocusStartDist.field_2) {
      operator_delete(sLocusStartDist._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusEndLong._M_dataplus._M_p != &sLocusEndLong.field_2) {
      operator_delete(sLocusEndLong._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusEndLat._M_dataplus._M_p != &sLocusEndLat.field_2) {
      operator_delete(sLocusEndLat._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartLong._M_dataplus._M_p != &sLocusStartLong.field_2) {
      operator_delete(sLocusStartLong._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartLat._M_dataplus._M_p != &sLocusStartLat.field_2) {
      operator_delete(sLocusStartLat._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusGeoEndLong._M_dataplus._M_p != &sLocusGeoEndLong.field_2) {
      operator_delete(sLocusGeoEndLong._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusGeoEndLat._M_dataplus._M_p != &sLocusGeoEndLat.field_2) {
      operator_delete(sLocusGeoEndLat._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusGeoStartLong._M_dataplus._M_p != &sLocusGeoStartLong.field_2) {
      operator_delete(sLocusGeoStartLong._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusGeoStartLat._M_dataplus._M_p != &sLocusGeoStartLat.field_2) {
      operator_delete(sLocusGeoStartLat._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sGeodesicEndLong._M_dataplus._M_p != &sGeodesicEndLong.field_2) {
      operator_delete(sGeodesicEndLong._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sGeodesicEndLat._M_dataplus._M_p != &sGeodesicEndLat.field_2) {
      operator_delete(sGeodesicEndLat._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sGeodesicStartLong._M_dataplus._M_p != &sGeodesicStartLong.field_2) {
      operator_delete(sGeodesicStartLong._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sGeodesicStartLat._M_dataplus._M_p != &sGeodesicStartLat.field_2) {
      operator_delete(sGeodesicStartLat._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sTestId._M_dataplus._M_p != &sTestId.field_2) {
      operator_delete(sTestId._M_dataplus._M_p);
    }
    _Unwind_Resume(uVar11);
  }
  sLine1->_M_string_length = uVar9;
  (sLine1->_M_dataplus)._M_p[uVar9] = '\0';
  std::__cxx11::string::find_first_not_of((char *)sLine1,0x15b244,0);
  std::__cxx11::string::erase((ulong)sLine1,0);
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  sGeodesicStartLat._M_dataplus._M_p = (pointer)&sGeodesicStartLat.field_2;
  sGeodesicStartLat._M_string_length = 0;
  sGeodesicStartLat.field_2._M_local_buf[0] = '\0';
  sGeodesicStartLong._M_dataplus._M_p = (pointer)&sGeodesicStartLong.field_2;
  sGeodesicStartLong._M_string_length = 0;
  sGeodesicStartLong.field_2._M_local_buf[0] = '\0';
  sGeodesicEndLat._M_dataplus._M_p = (pointer)&sGeodesicEndLat.field_2;
  sGeodesicEndLat._M_string_length = 0;
  sGeodesicEndLat.field_2._M_local_buf[0] = '\0';
  sGeodesicEndLong._M_dataplus._M_p = (pointer)&sGeodesicEndLong.field_2;
  sGeodesicEndLong._M_string_length = 0;
  sGeodesicEndLong.field_2._M_local_buf[0] = '\0';
  sLocusGeoEndLat._M_dataplus._M_p = (pointer)&sLocusGeoEndLat.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sLocusGeoEndLat,"([a-zA-Z]*\\d*)[,]","");
  std::__cxx11::string::append((char *)&sLocusGeoEndLat);
  std::__cxx11::string::append((char *)&sLocusGeoEndLat);
  std::__cxx11::string::append((char *)&sLocusGeoEndLat);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&sLocusGeoEndLong,
             &sLocusGeoEndLat,0x11);
  sLocusStartLong._M_dataplus._M_p = (pointer)0x200000001;
  sLocusStartLong._M_string_length = 0x400000003;
  sLocusStartLong.field_2._M_allocated_capacity._0_4_ = 5;
  __a._M_current = (sLine1->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<5ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&it,__a,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__a._M_current + sLine1->_M_string_length),(regex_type *)&sLocusGeoEndLong,
             (int (*) [5])&sLocusStartLong,0);
  sLocusGeoStartLat.field_2._M_allocated_capacity = 0;
  sLocusGeoStartLat.field_2._8_8_ = 0;
  sLocusGeoStartLat._M_dataplus._M_p = (pointer)0x0;
  sLocusGeoStartLat._M_string_length = 0;
  bVar6 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator==(&it,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                            *)&sLocusGeoStartLat);
  if (!bVar6) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    if (local_3b8->matched == true) {
      sLocusStartLat._M_dataplus._M_p = (pointer)&sLocusStartLat.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&sLocusStartLat,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      sLocusStartLat._M_dataplus._M_p = (pointer)&sLocusStartLat.field_2;
      sLocusStartLat._M_string_length = 0;
      sLocusStartLat.field_2._M_local_buf[0] = '\0';
    }
    std::__cxx11::string::operator=((string *)&sTestId,(string *)&sLocusStartLat);
    paVar1 = &sLocusStartLat.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartLat._M_dataplus._M_p != paVar1) {
      operator_delete(sLocusStartLat._M_dataplus._M_p);
    }
    if (local_3f0 != (pointer)0x0) {
      operator_delete(local_3f0);
    }
    if (local_410 != (pointer)0x0) {
      operator_delete(local_410);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    sLocusStartLat._M_dataplus._M_p = (pointer)paVar1;
    if (local_3b8->matched == true) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&sLocusStartLat,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      sLocusStartLat._M_string_length = 0;
      sLocusStartLat.field_2._M_local_buf[0] = '\0';
    }
    std::__cxx11::string::operator=((string *)&sGeodesicStartLat,(string *)&sLocusStartLat);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartLat._M_dataplus._M_p != paVar1) {
      operator_delete(sLocusStartLat._M_dataplus._M_p);
    }
    if (local_3f0 != (pointer)0x0) {
      operator_delete(local_3f0);
    }
    if (local_410 != (pointer)0x0) {
      operator_delete(local_410);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    if (local_3b8->matched == true) {
      sLocusStartLat._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&sLocusStartLat,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      sLocusStartLat._M_string_length = 0;
      sLocusStartLat.field_2._M_local_buf[0] = '\0';
      sLocusStartLat._M_dataplus._M_p = (pointer)paVar1;
    }
    std::__cxx11::string::operator=((string *)&sGeodesicStartLong,(string *)&sLocusStartLat);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartLat._M_dataplus._M_p != paVar1) {
      operator_delete(sLocusStartLat._M_dataplus._M_p);
    }
    if (local_3f0 != (pointer)0x0) {
      operator_delete(local_3f0);
    }
    if (local_410 != (pointer)0x0) {
      operator_delete(local_410);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    if (local_3b8->matched == true) {
      sLocusStartLat._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&sLocusStartLat,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      sLocusStartLat._M_string_length = 0;
      sLocusStartLat.field_2._M_local_buf[0] = '\0';
      sLocusStartLat._M_dataplus._M_p = (pointer)paVar1;
    }
    std::__cxx11::string::operator=((string *)&sGeodesicEndLat,(string *)&sLocusStartLat);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartLat._M_dataplus._M_p != paVar1) {
      operator_delete(sLocusStartLat._M_dataplus._M_p);
    }
    if (local_3f0 != (pointer)0x0) {
      operator_delete(local_3f0);
    }
    if (local_410 != (pointer)0x0) {
      operator_delete(local_410);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    if (local_3b8->matched == true) {
      sLocusStartLat._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&sLocusStartLat,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_3b8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      sLocusStartLat._M_string_length = 0;
      sLocusStartLat.field_2._M_local_buf[0] = '\0';
      sLocusStartLat._M_dataplus._M_p = (pointer)paVar1;
    }
    std::__cxx11::string::operator=((string *)&sGeodesicEndLong,(string *)&sLocusStartLat);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sLocusStartLat._M_dataplus._M_p != paVar1) {
      operator_delete(sLocusStartLat._M_dataplus._M_p);
    }
    if (local_3f0 != (pointer)0x0) {
      operator_delete(local_3f0);
    }
    if (local_410 != (pointer)0x0) {
      operator_delete(local_410);
    }
  }
  if (it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(it._M_position._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sLocusGeoEndLong);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusGeoEndLat._M_dataplus._M_p != &sLocusGeoEndLat.field_2) {
    operator_delete(sLocusGeoEndLat._M_dataplus._M_p);
  }
  sLocusGeoStartLat._M_dataplus._M_p = (pointer)&sLocusGeoStartLat.field_2;
  sLocusGeoStartLat._M_string_length = 0;
  sLocusGeoStartLat.field_2._M_allocated_capacity =
       sLocusGeoStartLat.field_2._M_allocated_capacity & 0xffffffffffffff00;
  sLocusGeoStartLong._M_dataplus._M_p = (pointer)&sLocusGeoStartLong.field_2;
  sLocusGeoStartLong._M_string_length = 0;
  sLocusGeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocusGeoEndLat._M_dataplus._M_p = (pointer)&sLocusGeoEndLat.field_2;
  sLocusGeoEndLat._M_string_length = 0;
  sLocusGeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocusGeoEndLong._M_dataplus._M_p = (pointer)&sLocusGeoEndLong.field_2;
  sLocusGeoEndLong._M_string_length = 0;
  sLocusGeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocusStartLat._M_dataplus._M_p = (pointer)&sLocusStartLat.field_2;
  sLocusStartLat._M_string_length = 0;
  sLocusStartLat.field_2._M_local_buf[0] = '\0';
  sLocusStartLong._M_dataplus._M_p = (pointer)&sLocusStartLong.field_2;
  sLocusStartLong._M_string_length = 0;
  sLocusStartLong.field_2._M_allocated_capacity._0_4_ =
       sLocusStartLong.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  sLocusEndLat._M_dataplus._M_p = (pointer)&sLocusEndLat.field_2;
  sLocusEndLat._M_string_length = 0;
  sLocusEndLat.field_2._M_local_buf[0] = '\0';
  sLocusEndLong._M_dataplus._M_p = (pointer)&sLocusEndLong.field_2;
  sLocusEndLong._M_string_length = 0;
  sLocusEndLong.field_2._M_local_buf[0] = '\0';
  sLocusStartDist._M_dataplus._M_p = (pointer)&sLocusStartDist.field_2;
  sLocusStartDist._M_string_length = 0;
  sLocusStartDist.field_2._M_local_buf[0] = '\0';
  sLocusEndDist._M_dataplus._M_p = (pointer)&sLocusEndDist.field_2;
  sLocusEndDist._M_string_length = 0;
  sLocusEndDist.field_2._M_local_buf[0] = '\0';
  sIntersectionLat._M_dataplus._M_p = (pointer)&sIntersectionLat.field_2;
  sIntersectionLat._M_string_length = 0;
  sIntersectionLat.field_2._M_local_buf[0] = '\0';
  sIntersectionLong._M_string_length = 0;
  sIntersectionLong.field_2._M_local_buf[0] = '\0';
  pcVar2 = (sLine2->_M_dataplus)._M_p;
  sIntersectionLong._M_dataplus._M_p = (pointer)&sIntersectionLong.field_2;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + sLine2->_M_string_length);
  bVar6 = ParseGeoLocusIntersect2
                    (&local_d8,&sLocusGeoStartLat,&sLocusGeoStartLong,&sLocusGeoEndLat,
                     &sLocusGeoEndLong,&sLocusStartLat,&sLocusStartLong,&sLocusEndLat,&sLocusEndLong
                     ,&sLocusStartDist,&sLocusEndDist);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (bVar6) {
    pcVar2 = (sLine3->_M_dataplus)._M_p;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + sLine3->_M_string_length);
    bVar6 = ParseGeoLocusIntersect3(&local_f8,&sIntersectionLat,&sIntersectionLong);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (bVar6) {
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      it._M_position._M_match._M_begin._M_current = (char *)0x0;
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      it._M_position._M_pregex = (regex_type *)0x0;
      it._M_position._M_flags = 0;
      it._M_position._28_4_ = 0;
      it._M_position._M_begin._M_current = (char *)0x0;
      it._M_position._M_end._M_current = (char *)0x0;
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,sLocusGeoStartLat._M_dataplus._M_p,
                 sLocusGeoStartLat._M_dataplus._M_p + sLocusGeoStartLat._M_string_length);
      dVar13 = ParseLatitude(&local_118);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,sLocusGeoStartLong._M_dataplus._M_p,
                 sLocusGeoStartLong._M_dataplus._M_p + sLocusGeoStartLong._M_string_length);
      dVar14 = ParseLongitude(&local_138);
      it._M_position._M_begin._M_current = (char *)(dVar13 * 0.017453292519943295);
      it._M_position._M_end._M_current = (char *)(dVar14 * 0.017453292519943295);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,sLocusGeoEndLat._M_dataplus._M_p,
                 sLocusGeoEndLat._M_dataplus._M_p + sLocusGeoEndLat._M_string_length);
      dVar13 = ParseLatitude(&local_158);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,sLocusGeoEndLong._M_dataplus._M_p,
                 sLocusGeoEndLong._M_dataplus._M_p + sLocusGeoEndLong._M_string_length);
      dVar14 = ParseLongitude(&local_178);
      it._M_position._M_pregex = (regex_type *)(dVar13 * 0.017453292519943295);
      it._M_position._24_8_ = dVar14 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,sLocusStartLat._M_dataplus._M_p,
                 sLocusStartLat._M_dataplus._M_p + sLocusStartLat._M_string_length);
      dVar13 = ParseLatitude(&local_198);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,sLocusStartLong._M_dataplus._M_p,
                 sLocusStartLong._M_dataplus._M_p + sLocusStartLong._M_string_length);
      dVar14 = ParseLongitude(&local_1b8);
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar13 * 0.017453292519943295);
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(dVar14 * 0.017453292519943295);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,sLocusEndLat._M_dataplus._M_p,
                 sLocusEndLat._M_dataplus._M_p + sLocusEndLat._M_string_length);
      dVar13 = ParseLatitude(&local_1d8);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,sLocusEndLong._M_dataplus._M_p,
                 sLocusEndLong._M_dataplus._M_p + sLocusEndLong._M_string_length);
      dVar14 = ParseLongitude(&local_1f8);
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar13 * 0.017453292519943295);
      it._M_position._M_match._M_begin._M_current = (char *)(dVar14 * 0.017453292519943295);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      dVar13 = atof(sLocusStartDist._M_dataplus._M_p);
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar13 * 1852.0);
      dVar13 = atof(sLocusEndDist._M_dataplus._M_p);
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(dVar13 * 1852.0);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,sGeodesicStartLat._M_dataplus._M_p,
                 sGeodesicStartLat._M_dataplus._M_p + sGeodesicStartLat._M_string_length);
      dVar13 = ParseLatitude(&local_218);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,sGeodesicStartLong._M_dataplus._M_p,
                 sGeodesicStartLong._M_dataplus._M_p + sGeodesicStartLong._M_string_length);
      dVar14 = ParseLongitude(&local_238);
      geoStart.latitude = dVar13 * 0.017453292519943295;
      geoStart.longitude = dVar14 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,sGeodesicEndLat._M_dataplus._M_p,
                 sGeodesicEndLat._M_dataplus._M_p + sGeodesicEndLat._M_string_length);
      dVar13 = ParseLatitude(&local_258);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,sGeodesicEndLong._M_dataplus._M_p,
                 sGeodesicEndLong._M_dataplus._M_p + sGeodesicEndLong._M_string_length);
      dVar14 = ParseLongitude(&local_278);
      geoEnd.latitude = dVar13 * 0.017453292519943295;
      geoEnd.longitude = dVar14 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      intersection.latitude = 0.0;
      intersection.longitude = 0.0;
      iVar7 = GeoCalcs::GeoLocusIntersect(&geoStart,&geoEnd,(Locus *)&it,&intersection,1e-09,5e-16);
      if (iVar7 != 0) {
        sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
        ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
        local_4b8 = intersection.longitude * 57.29577951308232;
        ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_4b8);
        sVar5 = sIntersectionLat._M_string_length;
        _Var4 = sIntersectionLat._M_dataplus;
        sVar3 = sPtIntLat._M_string_length;
        sVar12 = sPtIntLat._M_string_length;
        if (sIntersectionLat._M_string_length < sPtIntLat._M_string_length) {
          sVar12 = sIntersectionLat._M_string_length;
        }
        if (sVar12 == 0) {
          bVar6 = true;
          if (sPtIntLat._M_string_length != sIntersectionLat._M_string_length) goto LAB_001372e6;
        }
        else {
          iVar7 = bcmp(sPtIntLat._M_dataplus._M_p,sIntersectionLat._M_dataplus._M_p,sVar12);
          if ((sVar3 != sVar5) || (bVar6 = true, iVar7 != 0)) {
LAB_001372e6:
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,_Var4._M_p,_Var4._M_p + sVar5);
            dVar13 = ParseLatitude(&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            dVar15 = ABS(dVar13 * 0.017453292519943295);
            dVar14 = ABS(intersection.latitude);
            if (dVar15 <= ABS(intersection.latitude)) {
              dVar14 = dVar15;
            }
            if (ABS(dVar13 * 0.017453292519943295 - intersection.latitude) <= dVar14 * 1e-10) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                   sTestId._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," within rounding tolerance of 1e-10: Intersect Latitude: ",0x39);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,sIntersectionLat._M_dataplus._M_p,
                                   sIntersectionLat._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," calced: ",9);
              bVar6 = true;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                   sTestId._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," failed: Expected Intersect latitude: ",0x26);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,sIntersectionLat._M_dataplus._M_p,
                                   sIntersectionLat._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  calced: ",10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
              bVar6 = false;
            }
          }
        }
        sVar5 = sIntersectionLong._M_string_length;
        _Var4._M_p = sIntersectionLong._M_dataplus._M_p;
        sVar3 = sPtIntLon._M_string_length;
        sVar12 = sPtIntLon._M_string_length;
        if (sIntersectionLong._M_string_length < sPtIntLon._M_string_length) {
          sVar12 = sIntersectionLong._M_string_length;
        }
        if (sVar12 == 0) {
          if (sPtIntLon._M_string_length != sIntersectionLong._M_string_length) goto LAB_001374e8;
        }
        else {
          iVar7 = bcmp(sPtIntLon._M_dataplus._M_p,sIntersectionLong._M_dataplus._M_p,sVar12);
          if ((sVar3 != sVar5) || (iVar7 != 0)) {
LAB_001374e8:
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2b8,_Var4._M_p,_Var4._M_p + sVar5);
            dVar13 = ParseLongitude(&local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p);
            }
            dVar15 = ABS(dVar13 * 0.017453292519943295);
            dVar14 = ABS(intersection.longitude);
            if (dVar15 <= ABS(intersection.longitude)) {
              dVar14 = dVar15;
            }
            if (ABS(dVar13 * 0.017453292519943295 - intersection.longitude) <= dVar14 * 1e-10) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                   sTestId._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," within rounding tolerance of 1e-10: Intersect Longitude: ",0x3a);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,sIntersectionLong._M_dataplus._M_p,
                                   sIntersectionLong._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," calced: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                   sTestId._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," failed: Expected Intersect longitude: ",0x27);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,sIntersectionLong._M_dataplus._M_p,
                                   sIntersectionLong._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  calced: ",10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
              bVar6 = false;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sPtIntLon._M_dataplus._M_p != &sPtIntLon.field_2) {
          operator_delete(sPtIntLon._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sPtIntLat._M_dataplus._M_p != &sPtIntLat.field_2) {
          operator_delete(sPtIntLat._M_dataplus._M_p);
        }
        goto LAB_00137120;
      }
      iVar7 = std::__cxx11::string::compare((char *)&sIntersectionLat);
      if (iVar7 == 0) {
        bVar6 = true;
        goto LAB_00137120;
      }
      sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
      ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
      local_4b8 = intersection.longitude * 57.29577951308232;
      ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_4b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,sTestId._M_dataplus._M_p,sTestId._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"failed: Expected no solution. Calced a solution of Latitude",0x3b);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," and Longitude ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sPtIntLon._M_dataplus._M_p != &sPtIntLon.field_2) {
        operator_delete(sPtIntLon._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sPtIntLat._M_dataplus._M_p != &sPtIntLat.field_2) {
        operator_delete(sPtIntLat._M_dataplus._M_p);
      }
    }
  }
  bVar6 = false;
LAB_00137120:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sIntersectionLong._M_dataplus._M_p != &sIntersectionLong.field_2) {
    operator_delete(sIntersectionLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sIntersectionLat._M_dataplus._M_p != &sIntersectionLat.field_2) {
    operator_delete(sIntersectionLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusEndDist._M_dataplus._M_p != &sLocusEndDist.field_2) {
    operator_delete(sLocusEndDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusStartDist._M_dataplus._M_p != &sLocusStartDist.field_2) {
    operator_delete(sLocusStartDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusEndLong._M_dataplus._M_p != &sLocusEndLong.field_2) {
    operator_delete(sLocusEndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusEndLat._M_dataplus._M_p != &sLocusEndLat.field_2) {
    operator_delete(sLocusEndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusStartLong._M_dataplus._M_p != &sLocusStartLong.field_2) {
    operator_delete(sLocusStartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusStartLat._M_dataplus._M_p != &sLocusStartLat.field_2) {
    operator_delete(sLocusStartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusGeoEndLong._M_dataplus._M_p != &sLocusGeoEndLong.field_2) {
    operator_delete(sLocusGeoEndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusGeoEndLat._M_dataplus._M_p != &sLocusGeoEndLat.field_2) {
    operator_delete(sLocusGeoEndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusGeoStartLong._M_dataplus._M_p != &sLocusGeoStartLong.field_2) {
    operator_delete(sLocusGeoStartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocusGeoStartLat._M_dataplus._M_p != &sLocusGeoStartLat.field_2) {
    operator_delete(sLocusGeoStartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sGeodesicEndLong._M_dataplus._M_p != &sGeodesicEndLong.field_2) {
    operator_delete(sGeodesicEndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sGeodesicEndLat._M_dataplus._M_p != &sGeodesicEndLat.field_2) {
    operator_delete(sGeodesicEndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sGeodesicStartLong._M_dataplus._M_p != &sGeodesicStartLong.field_2) {
    operator_delete(sGeodesicStartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sGeodesicStartLat._M_dataplus._M_p != &sGeodesicStartLat.field_2) {
    operator_delete(sGeodesicStartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sTestId._M_dataplus._M_p != &sTestId.field_2) {
    operator_delete(sTestId._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

bool ParseGeoLocusIntersect(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;
    trim(sLine1);
    string sTestId, sGeodesicStartLat, sGeodesicStartLong, sGeodesicEndLat, sGeodesicEndLong;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "[A-z ]+[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        regex pat(sRxPat, flags);
        int sub_matches[] = {1, 2, 3, 4, 5,};
        sregex_token_iterator it(sLine1.begin(), sLine1.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sGeodesicStartLat = *it++;
            sGeodesicStartLong = *it++;
            sGeodesicEndLat = *it++;
            sGeodesicEndLong = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }
    string sLocusGeoStartLat, sLocusGeoStartLong, sLocusGeoEndLat, sLocusGeoEndLong;
    string sLocusStartLat, sLocusStartLong, sLocusEndLat, sLocusEndLong;
    string sLocusStartDist, sLocusEndDist, sIntersectionLat, sIntersectionLong;

    if (!ParseGeoLocusIntersect2(sLine2, sLocusGeoStartLat, sLocusGeoStartLong, sLocusGeoEndLat, sLocusGeoEndLong,
                                 sLocusStartLat, sLocusStartLong, sLocusEndLat, sLocusEndLong, sLocusStartDist,
                                 sLocusEndDist))
        bPassed = false;
    else
    {
        if (!ParseGeoLocusIntersect3(sLine3, sIntersectionLat, sIntersectionLong))
            bPassed = false;
        else
        {
            Locus locus;
            locus.geoStart.Set(Deg2Rad(ParseLatitude(sLocusGeoStartLat)), Deg2Rad(ParseLongitude(sLocusGeoStartLong)));
            locus.geoEnd.Set(Deg2Rad(ParseLatitude(sLocusGeoEndLat)), Deg2Rad(ParseLongitude(sLocusGeoEndLong)));
            locus.locusStart.Set(Deg2Rad(ParseLatitude(sLocusStartLat)), Deg2Rad(ParseLongitude(sLocusStartLong)));
            locus.locusEnd.Set(Deg2Rad(ParseLatitude(sLocusEndLat)), Deg2Rad(ParseLongitude(sLocusEndLong)));
            locus.startDist = NmToMeters(atof(sLocusStartDist.c_str()));
            locus.endDist = NmToMeters(atof(sLocusEndDist.c_str()));

            LLPoint geoStart(Deg2Rad(ParseLatitude(sGeodesicStartLat)), Deg2Rad(ParseLongitude(sGeodesicStartLong)));
            LLPoint geoEnd(Deg2Rad(ParseLatitude(sGeodesicEndLat)), Deg2Rad(ParseLongitude(sGeodesicEndLong)));

            LLPoint intersection;
            int nVal = GeoLocusIntersect(geoStart, geoEnd, locus, intersection, kTol, kEps);
            if (nVal == 0)
            {
                if (sIntersectionLat.compare("N/A") != 0)
                {
                    string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
                    string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
                    cout << "\n" << sTestId << "failed: Expected no solution. Calced a solution of Latitude" <<
                    sPtIntLat << " and Longitude " << sPtIntLon;
                    bPassed = false;
                }
            }
            else
            {
                string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
                string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
                if (sPtIntLat.compare(sIntersectionLat) != 0)
                {
                    double dLat = Deg2Rad(ParseLatitude(sIntersectionLat));
                    if (IsApprox(dLat, intersection.latitude, 1e-10))
                        cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect Latitude: " <<
                        sIntersectionLat << " calced: " << sPtIntLat;
                    else
                    {
                        cout << "\n" << sTestId << " failed: Expected Intersect latitude: " << sIntersectionLat <<
                        "  calced: " << sPtIntLat;
                        bPassed = false;
                    }
                }
                if (sPtIntLon.compare(sIntersectionLong) != 0)
                {
                    double dLon = Deg2Rad(ParseLongitude(sIntersectionLong));
                    if (IsApprox(dLon, intersection.longitude, 1e-10))
                        cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect Longitude: " <<
                        sIntersectionLong << " calced: " << sPtIntLon;
                    else
                    {
                        cout << "\n" << sTestId << " failed: Expected Intersect longitude: " << sIntersectionLong <<
                        "  calced: " << sPtIntLon;
                        bPassed = false;
                    }
                }

            }
        }
    }
    return bPassed;
}